

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

Expression *
slang::ast::TaggedUnionExpression::fromSyntax
          (Compilation *compilation,TaggedUnionExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  ExpressionSyntax *pEVar1;
  SyntaxNode *this;
  bool bVar2;
  Scope *this_00;
  Symbol *args_1;
  Type *pTVar3;
  SourceLocation location;
  Expression *pEVar4;
  Type *pTVar5;
  TaggedUnionExpression *expr;
  Diagnostic *pDVar6;
  string_view name;
  SourceRange SVar7;
  Expression *valueExpr;
  Expression *local_48;
  Token local_40;
  
  if (assignmentTarget != (Type *)0x0) {
    bVar2 = Type::isTaggedUnion(assignmentTarget);
    if (bVar2) {
      name = parsing::Token::valueText(&syntax->member);
      pTVar3 = assignmentTarget->canonical;
      if (pTVar3 == (Type *)0x0) {
        Type::resolveCanonical(assignmentTarget);
        pTVar3 = assignmentTarget->canonical;
      }
      this_00 = Symbol::as<slang::ast::Scope>(&pTVar3->super_Symbol);
      args_1 = Scope::find(this_00,name);
      if (args_1 != (Symbol *)0x0) {
        if (args_1->kind != Field) {
          assert::assertFailed
                    ("T::isKind(kind)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                     ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::FieldSymbol]");
        }
        local_48 = (Expression *)0x0;
        pEVar1 = syntax->expr;
        pTVar3 = DeclaredType::getType((DeclaredType *)(args_1 + 1));
        if (pEVar1 == (ExpressionSyntax *)0x0) {
          pTVar5 = pTVar3->canonical;
          if (pTVar5 == (Type *)0x0) {
            Type::resolveCanonical(pTVar3);
            pTVar5 = pTVar3->canonical;
          }
          if ((pTVar5->super_Symbol).kind != VoidType) {
            SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
            pDVar6 = ASTContext::addDiag(context,(DiagCode)0x870007,SVar7);
            Diagnostic::operator<<(pDVar6,args_1->name);
            goto LAB_003bd755;
          }
        }
        else {
          this = &syntax->expr->super_SyntaxNode;
          local_40 = slang::syntax::SyntaxNode::getFirstToken(this);
          location = parsing::Token::location(&local_40);
          local_48 = Expression::bindRValue
                               (pTVar3,(ExpressionSyntax *)this,location,context,
                                (bitmask<slang::ast::ASTFlags>)0x0);
        }
        local_40 = (Token)slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        expr = BumpAllocator::
               emplace<slang::ast::TaggedUnionExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::Expression_const*&,slang::SourceRange>
                         (&compilation->super_BumpAllocator,assignmentTarget,args_1,&local_48,
                          (SourceRange *)&local_40);
        if ((local_48 != (Expression *)0x0) && (bVar2 = Expression::bad(local_48), bVar2)) {
          expr = (TaggedUnionExpression *)Expression::badExpr(compilation,&expr->super_Expression);
        }
        return &expr->super_Expression;
      }
      if (name._M_len != 0) {
        SVar7 = parsing::Token::range(&syntax->member);
        pDVar6 = ASTContext::addDiag(context,(DiagCode)0x33000a,SVar7);
        pDVar6 = Diagnostic::operator<<(pDVar6,name);
        ast::operator<<(pDVar6,assignmentTarget);
      }
      goto LAB_003bd755;
    }
    pTVar3 = assignmentTarget->canonical;
    if (pTVar3 == (Type *)0x0) {
      Type::resolveCanonical(assignmentTarget);
      pTVar3 = assignmentTarget->canonical;
    }
    if ((pTVar3->super_Symbol).kind == ErrorType) goto LAB_003bd755;
  }
  SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  ASTContext::addDiag(context,(DiagCode)0x880007,SVar7);
LAB_003bd755:
  pEVar4 = Expression::badExpr(compilation,(Expression *)0x0);
  return pEVar4;
}

Assistant:

Expression& TaggedUnionExpression::fromSyntax(Compilation& compilation,
                                              const TaggedUnionExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    if (!assignmentTarget || !assignmentTarget->isTaggedUnion()) {
        if (!assignmentTarget || !assignmentTarget->isError())
            context.addDiag(diag::TaggedUnionTarget, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    auto memberName = syntax.member.valueText();
    auto member = assignmentTarget->getCanonicalType().as<Scope>().find(memberName);
    if (!member) {
        if (!memberName.empty()) {
            auto& diag = context.addDiag(diag::UnknownMember, syntax.member.range());
            diag << memberName << *assignmentTarget;
        }
        return badExpr(compilation, nullptr);
    }

    auto& field = member->as<FieldSymbol>();

    const Expression* valueExpr = nullptr;
    if (syntax.expr) {
        valueExpr = &bindRValue(field.getType(), *syntax.expr,
                                syntax.expr->getFirstToken().location(), context);
    }
    else if (!field.getType().isVoid()) {
        context.addDiag(diag::TaggedUnionMissingInit, syntax.sourceRange()) << field.name;
        return badExpr(compilation, nullptr);
    }

    auto result = compilation.emplace<TaggedUnionExpression>(*assignmentTarget, *member, valueExpr,
                                                             syntax.sourceRange());
    if (valueExpr && valueExpr->bad())
        return badExpr(compilation, result);

    return *result;
}